

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::JunitReporter::writeGroup(JunitReporter *this,TestGroupNode *groupNode,double suiteTime)

{
  XmlWriter *this_00;
  pointer pPVar1;
  int iVar2;
  pointer pPVar3;
  double local_a8;
  double suiteTime_local;
  undefined1 local_80 [8];
  ScopedElement e;
  ScopedElement local_58;
  string local_50;
  allocator<char> local_29;
  
  local_a8 = suiteTime;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"testsuite",(allocator<char> *)&e);
  this_00 = &this->xml;
  XmlWriter::scopedElement((XmlWriter *)local_80,(string *)this_00);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"name",(allocator<char> *)&e);
  XmlWriter::writeAttribute(this_00,&local_50,&(groupNode->value).groupInfo.name);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"errors",(allocator<char> *)&e);
  XmlWriter::writeAttribute<unsigned_int>(this_00,&local_50,&this->unexpectedExceptions);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"failures",(allocator<char> *)&suiteTime_local);
  e.m_writer = (XmlWriter *)
               ((groupNode->value).totals.assertions.failed - (ulong)this->unexpectedExceptions);
  XmlWriter::writeAttribute<unsigned_long>(this_00,&local_50,(unsigned_long *)&e);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"tests",(allocator<char> *)&suiteTime_local);
  e.m_writer = (XmlWriter *)
               ((groupNode->value).totals.assertions.failed +
                (groupNode->value).totals.assertions.passed +
               (groupNode->value).totals.assertions.failedButOk);
  XmlWriter::writeAttribute<unsigned_long>(this_00,&local_50,(unsigned_long *)&e);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"hostname",(allocator<char> *)&e);
  XmlWriter::writeAttribute<char[4]>(this_00,&local_50,(char (*) [4])"tbd");
  std::__cxx11::string::~string((string *)&local_50);
  iVar2 = (*(((this->super_CumulativeReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
            _vptr_NonCopyable[0xc])();
  if (iVar2 == 2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"time",(allocator<char> *)&e);
    XmlWriter::writeAttribute<char[1]>(this_00,&local_50,(char (*) [1])0x164b19);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"time",(allocator<char> *)&e);
    XmlWriter::writeAttribute<double>(this_00,&local_50,&local_a8);
  }
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"timestamp",(allocator<char> *)&e);
  XmlWriter::writeAttribute<char[4]>(this_00,&local_50,(char (*) [4])"tbd");
  std::__cxx11::string::~string((string *)&local_50);
  pPVar1 = (groupNode->children).
           super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pPVar3 = (groupNode->children).
                super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pPVar3 != pPVar1; pPVar3 = pPVar3 + 1) {
    writeTestCase(this,pPVar3->m_p);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"system-out",&local_29);
  XmlWriter::scopedElement((XmlWriter *)&local_58,(string *)this_00);
  std::__cxx11::stringbuf::str();
  trim((string *)&e,(string *)&suiteTime_local);
  XmlWriter::writeText(local_58.m_writer,(string *)&e,false);
  std::__cxx11::string::~string((string *)&e);
  std::__cxx11::string::~string((string *)&suiteTime_local);
  XmlWriter::ScopedElement::~ScopedElement(&local_58);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"system-err",&local_29);
  XmlWriter::scopedElement((XmlWriter *)&local_58,(string *)this_00);
  std::__cxx11::stringbuf::str();
  trim((string *)&e,(string *)&suiteTime_local);
  XmlWriter::writeText(local_58.m_writer,(string *)&e,false);
  std::__cxx11::string::~string((string *)&e);
  std::__cxx11::string::~string((string *)&suiteTime_local);
  XmlWriter::ScopedElement::~ScopedElement(&local_58);
  std::__cxx11::string::~string((string *)&local_50);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_80);
  return;
}

Assistant:

void writeGroup( TestGroupNode const& groupNode, double suiteTime ) {
            XmlWriter::ScopedElement e = xml.scopedElement( "testsuite" );
            TestGroupStats const& stats = groupNode.value;
            xml.writeAttribute( "name", stats.groupInfo.name );
            xml.writeAttribute( "errors", unexpectedExceptions );
            xml.writeAttribute( "failures", stats.totals.assertions.failed-unexpectedExceptions );
            xml.writeAttribute( "tests", stats.totals.assertions.total() );
            xml.writeAttribute( "hostname", "tbd" ); // !TBD
            if( m_config->showDurations() == ShowDurations::Never )
                xml.writeAttribute( "time", "" );
            else
                xml.writeAttribute( "time", suiteTime );
            xml.writeAttribute( "timestamp", "tbd" ); // !TBD

            // Write test cases
            for( TestGroupNode::ChildNodes::const_iterator
                    it = groupNode.children.begin(), itEnd = groupNode.children.end();
                    it != itEnd;
                    ++it )
                writeTestCase( **it );

            xml.scopedElement( "system-out" ).writeText( trim( stdOutForSuite.str() ), false );
            xml.scopedElement( "system-err" ).writeText( trim( stdErrForSuite.str() ), false );
        }